

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*>
               (char *args,duration<long,_std::ratio<1L,_1000000000L>_> args_1,char *args_2,
               duration<long,_std::ratio<1L,_1000000000L>_> args_3,char *args_4)

{
  Exception *this;
  string local_200;
  rep local_1d0;
  rep local_1c8;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*>
  local_1b9;
  stringstream local_1b8 [8];
  stringstream msg;
  char *args_local_4;
  char *args_local_2;
  char *args_local;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local_3;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local_1;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d0 = args_3.__r;
  local_1c8 = args_1.__r;
  detail::
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*>
  ::operator()(&local_1b9,(stringstream *)local_1b8,args,args_1,args_2,args_3,args_4);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_200);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}